

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BlitDefaultFramebufferCase::preCheck(BlitDefaultFramebufferCase *this)

{
  RenderTarget *pRVar1;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  
  pRVar1 = Context::getRenderTarget((this->super_FboTestCase).super_TestCase.m_context);
  if (pRVar1->m_numSamples < 1) {
    FboTestCase::checkFormatSupport(&this->super_FboTestCase,this->m_format);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Not supported in MSAA config",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void preCheck (void)
	{
		if (m_context.getRenderTarget().getNumSamples() > 0)
			throw tcu::NotSupportedError("Not supported in MSAA config");

		checkFormatSupport(m_format);
	}